

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_file_manager.cpp
# Opt level: O1

void __thiscall
duckdb::TemporaryFileHandle::TemporaryFileHandle
          (TemporaryFileHandle *this,TemporaryFileManager *manager,
          TemporaryFileIdentifier identifier_p,idx_t temp_file_count)

{
  pointer *__ptr;
  
  this->db = manager->db;
  (this->identifier).size = identifier_p.size;
  (this->identifier).file_index.index = identifier_p.file_index.index.index;
  this->max_allowed_index = (long)(1 << ((byte)temp_file_count & 0x1f)) * 4000;
  TemporaryFileManager::CreateTemporaryFileName_abi_cxx11_(&this->path,manager,&this->identifier);
  (this->file_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->file_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->file_lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->file_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->handle).super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t
  .super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
  super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl = (FileHandle *)0x0;
  (this->file_lock).super___mutex_base._M_mutex.__align = 0;
  BlockIndexManager::BlockIndexManager(&this->index_manager,manager);
  return;
}

Assistant:

TemporaryFileHandle::TemporaryFileHandle(TemporaryFileManager &manager, TemporaryFileIdentifier identifier_p,
                                         idx_t temp_file_count)
    : db(manager.db), identifier(identifier_p), max_allowed_index((1 << temp_file_count) * MAX_ALLOWED_INDEX_BASE),
      path(manager.CreateTemporaryFileName(identifier)), index_manager(manager) {
}